

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer *this_00;
  lexeme_t lVar1;
  nodetest_t nVar2;
  xpath_ast_node *pxVar3;
  xpath_lexer_string *pxVar4;
  xpath_ast_node *pxVar5;
  char_t *pcVar6;
  xpath_ast_node *pxVar7;
  xpath_ast_node *pxVar8;
  xpath_ast_node **ppxVar9;
  char cVar10;
  char *pcVar11;
  char cVar12;
  bool bVar13;
  xpath_lexer_string local_48;
  xpath_ast_node *local_38;
  
  if ((set != (xpath_ast_node *)0x0) && (set->_rettype != '\x01')) goto LAB_0011f9f7;
  this_00 = &this->_lexer;
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lVar1 == lex_double_dot) {
    xpath_lexer::next(this_00);
    pxVar3 = (xpath_ast_node *)alloc_node(this);
    pxVar3->_type = '8';
    pxVar3->_rettype = '\x01';
    pxVar3->_axis = '\t';
    pxVar3->_test = '\x02';
LAB_0011f657:
    pxVar3->_left = set;
    pxVar3->_right = (xpath_ast_node *)0x0;
    pxVar3->_next = (xpath_ast_node *)0x0;
    (pxVar3->_data).string = (char_t *)0x0;
    return pxVar3;
  }
  if (lVar1 == lex_dot) {
    xpath_lexer::next(this_00);
    pxVar3 = (xpath_ast_node *)alloc_node(this);
    pxVar3->_type = '8';
    pxVar3->_rettype = '\x01';
    pxVar3->_axis = '\f';
    pxVar3->_test = '\x02';
    goto LAB_0011f657;
  }
  bVar13 = lVar1 != lex_axis_attribute;
  pcVar11 = &set->_type;
  if (bVar13) {
    cVar12 = '\x03';
  }
  else {
    xpath_lexer::next(this_00);
    lVar1 = (this->_lexer)._cur_lexeme;
    cVar12 = '\x02';
  }
  local_48.begin = (char_t *)0x0;
  local_48.end = (char_t *)0x0;
  if (lVar1 == lex_multiply) goto LAB_0011f6f7;
  if (lVar1 != lex_string) goto LAB_0011fa00;
  pxVar4 = xpath_lexer::contents(this_00);
  local_48.begin = pxVar4->begin;
  local_48.end = pxVar4->end;
  xpath_lexer::next(this_00);
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lVar1 != lex_double_colon) goto LAB_0011f916;
  if (!bVar13) {
    pcVar11 = "Two axis specifiers in one step";
    goto LAB_0011f9ef;
  }
  cVar12 = *(char *)(xpath_memory_block **)local_48.begin;
  switch(cVar12) {
  case 'a':
    pcVar11 = "ancestor";
    bVar13 = xpath_lexer_string::operator==(&local_48,"ancestor");
    if (bVar13) {
      cVar12 = '\0';
    }
    else {
      pcVar11 = "ancestor-or-self";
      bVar13 = xpath_lexer_string::operator==(&local_48,"ancestor-or-self");
      cVar12 = '\x01';
      if (!bVar13) {
        pcVar11 = "attribute";
        bVar13 = xpath_lexer_string::operator==(&local_48,"attribute");
        cVar12 = '\x02';
        goto LAB_0011f8d4;
      }
    }
    break;
  case 'b':
  case 'e':
    goto switchD_0011f6d3_caseD_62;
  case 'c':
    pcVar11 = "child";
    bVar13 = xpath_lexer_string::operator==(&local_48,"child");
    cVar12 = '\x03';
    goto LAB_0011f8d4;
  case 'd':
    pcVar11 = "descendant";
    bVar13 = xpath_lexer_string::operator==(&local_48,"descendant");
    cVar12 = '\x04';
    if (!bVar13) {
      pcVar11 = "descendant-or-self";
      bVar13 = xpath_lexer_string::operator==(&local_48,"descendant-or-self");
      cVar12 = '\x05';
      goto LAB_0011f8d4;
    }
    break;
  case 'f':
    pcVar11 = "following";
    bVar13 = xpath_lexer_string::operator==(&local_48,"following");
    cVar12 = '\x06';
    if (!bVar13) {
      pcVar11 = "following-sibling";
      bVar13 = xpath_lexer_string::operator==(&local_48,"following-sibling");
      cVar12 = '\a';
      goto LAB_0011f8d4;
    }
    break;
  default:
    if (cVar12 == 'n') {
      pcVar11 = "namespace";
      bVar13 = xpath_lexer_string::operator==(&local_48,"namespace");
      cVar12 = '\b';
    }
    else {
      if (cVar12 == 'p') {
        pcVar11 = "parent";
        bVar13 = xpath_lexer_string::operator==(&local_48,"parent");
        cVar12 = '\t';
        if (!bVar13) {
          pcVar11 = "preceding";
          bVar13 = xpath_lexer_string::operator==(&local_48,"preceding");
          cVar12 = '\n';
          if (!bVar13) {
            pcVar11 = "preceding-sibling";
            bVar13 = xpath_lexer_string::operator==(&local_48,"preceding-sibling");
            cVar12 = '\v';
            goto LAB_0011f8d4;
          }
        }
        break;
      }
      if (cVar12 != 's') goto switchD_0011f6d3_caseD_62;
      pcVar11 = "self";
      bVar13 = xpath_lexer_string::operator==(&local_48,"self");
      cVar12 = '\f';
    }
LAB_0011f8d4:
    if (bVar13 == false) {
switchD_0011f6d3_caseD_62:
      pcVar11 = "Unknown axis";
      goto LAB_0011f9ef;
    }
  }
  xpath_lexer::next(this_00);
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lVar1 == lex_multiply) {
LAB_0011f6f7:
    local_48.end = (char_t *)0x0;
    local_48.begin = (char_t *)0x0;
    xpath_lexer::next(this_00);
    cVar10 = '\a';
  }
  else {
    if (lVar1 != lex_string) {
LAB_0011fa00:
      pcVar11 = "Unrecognized node test";
      goto LAB_0011f9ef;
    }
    pxVar4 = xpath_lexer::contents(this_00);
    local_48.begin = pxVar4->begin;
    local_48.end = pxVar4->end;
    xpath_lexer::next(this_00);
    lVar1 = (this->_lexer)._cur_lexeme;
LAB_0011f916:
    if (lVar1 == lex_open_brace) {
      xpath_lexer::next(this_00);
      lVar1 = (this->_lexer)._cur_lexeme;
      if (lVar1 == lex_close_brace) {
        xpath_lexer::next(this_00);
        nVar2 = parse_node_test_type((xpath_parser *)&local_48,(xpath_lexer_string *)pcVar11);
        if (nVar2 == nodetest_none) {
          pcVar11 = "Unrecognized node type";
          goto LAB_0011f9ef;
        }
        cVar10 = (char)nVar2;
        local_48.begin = (char_t *)0x0;
        local_48.end = (char_t *)0x0;
      }
      else {
        bVar13 = xpath_lexer_string::operator==(&local_48,"processing-instruction");
        if (!bVar13) {
          pcVar11 = "Unmatched brace near node type test";
          goto LAB_0011f9ef;
        }
        if (lVar1 != lex_quoted_string) {
          pcVar11 = "Only literals are allowed as arguments to processing-instruction()";
          goto LAB_0011f9ef;
        }
        pxVar4 = xpath_lexer::contents(this_00);
        local_48.begin = pxVar4->begin;
        local_48.end = pxVar4->end;
        xpath_lexer::next(this_00);
        if ((this->_lexer)._cur_lexeme != lex_close_brace) {
          pcVar11 = "Unmatched brace near processing-instruction()";
          goto LAB_0011f9ef;
        }
        xpath_lexer::next(this_00);
        cVar10 = '\x06';
      }
    }
    else {
      cVar10 = '\x01';
      if (((2 < (long)local_48.end - (long)local_48.begin) && (local_48.end[-2] == ':')) &&
         (local_48.end[-1] == '*')) {
        local_48.end = local_48.end + -1;
        cVar10 = '\b';
      }
    }
  }
  pxVar5 = (xpath_ast_node *)alloc_node(this);
  pcVar6 = alloc_string(this,&local_48);
  pxVar5->_type = '8';
  pxVar5->_rettype = '\x01';
  pxVar5->_axis = cVar12;
  pxVar5->_test = cVar10;
  pxVar5->_left = set;
  pxVar5->_right = (xpath_ast_node *)0x0;
  pxVar5->_next = (xpath_ast_node *)0x0;
  (pxVar5->_data).string = pcVar6;
  pxVar3 = (xpath_ast_node *)0x0;
  local_38 = pxVar5;
  while( true ) {
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      return local_38;
    }
    xpath_lexer::next(this_00);
    pxVar7 = parse_expression(this);
    pxVar8 = (xpath_ast_node *)alloc_node(this);
    pxVar8->_type = '\x0f';
    pxVar8->_rettype = '\x01';
    pxVar8->_axis = '\0';
    pxVar8->_test = '\0';
    pxVar8->_left = pxVar7;
    pxVar8->_right = (xpath_ast_node *)0x0;
    pxVar8->_next = (xpath_ast_node *)0x0;
    if ((this->_lexer)._cur_lexeme != lex_close_square_brace) break;
    xpath_lexer::next(this_00);
    ppxVar9 = &pxVar3->_next;
    if (pxVar3 == (xpath_ast_node *)0x0) {
      ppxVar9 = &pxVar5->_right;
    }
    *ppxVar9 = pxVar8;
    pxVar3 = pxVar8;
  }
  pcVar11 = "Unmatched square brace";
LAB_0011f9ef:
  do {
    throw_error(this,pcVar11);
LAB_0011f9f7:
    pcVar11 = "Step has to be applied to node set";
  } while( true );
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				throw_error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;
				
				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}
		
			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;
			
			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified) throw_error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified) throw_error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else throw_error("Unrecognized node test");
				}
				
				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();
						
						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none) throw_error("Unrecognized node type");
							
							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								throw_error("Only literals are allowed as arguments to processing-instruction()");
						
							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();
							
							if (_lexer.current() != lex_close_brace)
								throw_error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
							throw_error("Unmatched brace near node type test");

					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *
							
							nt_type = nodetest_all_in_namespace;
						}
						else nt_type = nodetest_name;
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else throw_error("Unrecognized node test");
			
			xpath_ast_node* n = new (alloc_node()) xpath_ast_node(ast_step, set, axis, nt_type, alloc_string(nt_name));
			
			xpath_ast_node* last = 0;
			
			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();
				
				xpath_ast_node* expr = parse_expression();

				xpath_ast_node* pred = new (alloc_node()) xpath_ast_node(ast_predicate, xpath_type_node_set, expr);
				
				if (_lexer.current() != lex_close_square_brace)
					throw_error("Unmatched square brace");
				_lexer.next();
				
				if (last) last->set_next(pred);
				else n->set_right(pred);
				
				last = pred;
			}
			
			return n;
		}